

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::contextMenuEvent
          (QWidgetTextControlPrivate *this,QPoint *screenPos,QPointF *docPos,QWidget *contextWidget)

{
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var1;
  int *piVar2;
  QWidget *this_01;
  QWidget *pQVar3;
  QWindow *pQVar4;
  QObject *pQVar5;
  undefined8 uVar6;
  
  this_01 = &QWidgetTextControl::createStandardContextMenu
                       (*(QWidgetTextControl **)&this->field_0x8,docPos,contextWidget)->
             super_QWidget;
  if (this_01 != (QWidget *)0x0) {
    QWidget::setAttribute(this_01,WA_DeleteOnClose,true);
    pQVar3 = *(QWidget **)&this->field_0x10;
    if ((pQVar3 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0)) {
      pQVar3 = QWidget::window(pQVar3);
      pQVar4 = QWidget::windowHandle(pQVar3);
      if (pQVar4 != (QWindow *)0x0) {
        pQVar5 = (QObject *)QWindow::screen();
        this_00 = *(QWidgetPrivate **)&this_01->field_0x8;
        QWidgetPrivate::createTLExtra(this_00);
        _Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
        super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
        if (pQVar5 == (QObject *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar5);
        }
        piVar2 = *(int **)((long)_Var1.
                                 super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>
                                 .super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
        *(undefined8 *)
         ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = uVar6;
        *(QObject **)
         ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = pQVar5;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            operator_delete(piVar2);
          }
        }
      }
    }
    QMenu::popup((QMenu *)this_01,screenPos,(QAction *)0x0);
    return;
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::contextMenuEvent(const QPoint &screenPos, const QPointF &docPos, QWidget *contextWidget)
{
#ifdef QT_NO_CONTEXTMENU
    Q_UNUSED(screenPos);
    Q_UNUSED(docPos);
    Q_UNUSED(contextWidget);
#else
    Q_Q(QWidgetTextControl);
    QMenu *menu = q->createStandardContextMenu(docPos, contextWidget);
    if (!menu)
        return;
    menu->setAttribute(Qt::WA_DeleteOnClose);

    if (auto *widget = qobject_cast<QWidget *>(parent)) {
        if (auto *window = widget->window()->windowHandle())
            QMenuPrivate::get(menu)->topData()->initialScreen = window->screen();
    }

    menu->popup(screenPos);
#endif
}